

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

uint8_t * apx_allocator_alloc(apx_allocator_t *self,size_t size)

{
  uint8_t *local_20;
  uint8_t *data;
  size_t size_local;
  apx_allocator_t *self_local;
  
  local_20 = (uint8_t *)0x0;
  if ((self != (apx_allocator_t *)0x0) && (size != 0)) {
    if (size < 0x21) {
      pthread_spin_lock(&self->lock);
      local_20 = (uint8_t *)soa_alloc(&self->soa,size);
      pthread_spin_unlock(&self->lock);
    }
    else {
      local_20 = (uint8_t *)malloc(size);
    }
  }
  return local_20;
}

Assistant:

uint8_t *apx_allocator_alloc(apx_allocator_t *self, size_t size)
{
   uint8_t *data = 0;
   if ( (self != 0) && (size > 0) )
   {
      if (size <= SOA_SMALL_OBJECT_MAX_SIZE)
      {
         //use the small object allocator
         SPINLOCK_ENTER(self->lock);
         data = (uint8_t*) soa_alloc(&self->soa, size);
         SPINLOCK_LEAVE(self->lock);
      }
      else
      {
         //use the default allocator
         data = (uint8_t*) malloc(size);
      }
   }
   return data;
}